

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FastInt64ToBufferLeft(int64 i,char *buffer)

{
  char *pcVar1;
  undefined1 *in_RSI;
  long in_RDI;
  uint64 u;
  char *in_stack_00000060;
  uint64 in_stack_00000068;
  
  if (in_RDI < 0) {
    *in_RSI = 0x2d;
  }
  pcVar1 = FastUInt64ToBufferLeft(in_stack_00000068,in_stack_00000060);
  return pcVar1;
}

Assistant:

char* FastInt64ToBufferLeft(int64 i, char* buffer) {
  uint64 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt64ToBufferLeft(u, buffer);
}